

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

void __thiscall
Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::TagT<212u,Fixpp::Type::Int>>>::
parse<Fixpp::impl::TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,Fixpp::Chars<>,Fixpp::Required<Fixpp::TagT<49u,Fixpp::Type::String>>,Fixpp::Required<Fixpp::TagT<56u,Fixpp::Type::String>>,Fixpp::TagT<115u,Fixpp::Type::String>,Fixpp::TagT<128u,Fixpp::Type::String>,Fixpp::TagT<90u,Fixpp::Type::Int>,Fixpp::TagT<91u,Fixpp::Type::Data>,Fixpp::Required<Fixpp::TagT<34u,Fixpp::Type::Int>>,Fixpp::TagT<50u,Fixpp::Type::String>,Fixpp::TagT<142u,Fixpp::Type::String>,Fixpp::TagT<57u,Fixpp::Type::String>,Fixpp::TagT<143u,Fixpp::Type::String>,Fixpp::TagT<116u,Fixpp::Type::String>,Fixpp::TagT<144u,Fixpp::Type::String>,Fixpp::TagT<129u,Fixpp::Type::String>,Fixpp::TagT<145u,Fixpp::Type::String>,Fixpp::TagT<43u,Fixpp::Type::Boolean>,Fixpp::TagT<97u,Fixpp::Type::Boolean>,Fixpp::Required<Fixpp::TagT<52u,Fixpp::Type::UTCTimestamp>>,Fixpp::TagT<122u,Fixpp::Type::UTCTimestamp>,Fixpp::TagT<212u,Fixpp::Type::Int>,Fixpp::TagT<213u,Fixpp::Type::Data>,Fixpp::TagT<347u,Fixpp::Type::String>,Fixpp::TagT<369u,Fixpp::Type::Int>,Fixpp::TagT<370u,Fixpp::Type::UTCTimestamp>>>>
          (FieldParser<Fixpp::FieldRef<Fixpp::TagT<212u,Fixpp::Type::Int>>> *this,Field *field,
          ParsingContext *context,
          TagSet<Fixpp::VersionnedMessageRef<Fixpp::v42::Version,_Fixpp::Chars<>,_Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>_>
          *tagSet,bool param_4,bool param_5)

{
  byte *pbVar1;
  StreamCursor *this_00;
  long lVar2;
  StreamBuf<char> *pSVar3;
  long lVar4;
  char cVar5;
  bool bVar6;
  long lVar7;
  char *pcVar8;
  Type type;
  
  this_00 = context->cursor;
  lVar2 = *(long *)&this_00->buf->field_0x8;
  pcVar8 = *(char **)&this_00->buf->field_0x10;
  while( true ) {
    pSVar3 = this_00->buf;
    if (*(long *)&pSVar3->field_0x18 == *(long *)&pSVar3->field_0x10) {
      lVar7 = (**(code **)(*(long *)pSVar3 + 0x38))();
      bVar6 = lVar7 == 0;
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      pcVar8 = "Expected value tag \'%d\', got EOF";
      type = ParsingError;
      goto LAB_00403bb7;
    }
    pSVar3 = this_00->buf;
    if (*(char **)&pSVar3->field_0x10 < *(char **)&pSVar3->field_0x18) {
      cVar5 = **(char **)&pSVar3->field_0x10;
    }
    else {
      cVar5 = (**(code **)(*(long *)pSVar3 + 0x48))();
    }
    if (cVar5 == '|') break;
    StreamCursor::advance(this_00,1);
  }
  lVar7 = *(long *)&this_00->buf->field_0x8;
  lVar4 = *(long *)&this_00->buf->field_0x10;
  bVar6 = StreamCursor::advance(this_00,1);
  if (bVar6) {
    (field->m_view).first = pcVar8;
    (field->m_view).second = (lVar2 + lVar4) - (long)(pcVar8 + lVar7);
    pbVar1 = (byte *)((long)(tagSet->
                            super_TagSet<Fixpp::Required<Fixpp::TagT<49U,_Fixpp::Type::String>_>,_Fixpp::Required<Fixpp::TagT<56U,_Fixpp::Type::String>_>,_Fixpp::TagT<115U,_Fixpp::Type::String>,_Fixpp::TagT<128U,_Fixpp::Type::String>,_Fixpp::TagT<90U,_Fixpp::Type::Int>,_Fixpp::TagT<91U,_Fixpp::Type::Data>,_Fixpp::Required<Fixpp::TagT<34U,_Fixpp::Type::Int>_>,_Fixpp::TagT<50U,_Fixpp::Type::String>,_Fixpp::TagT<142U,_Fixpp::Type::String>,_Fixpp::TagT<57U,_Fixpp::Type::String>,_Fixpp::TagT<143U,_Fixpp::Type::String>,_Fixpp::TagT<116U,_Fixpp::Type::String>,_Fixpp::TagT<144U,_Fixpp::Type::String>,_Fixpp::TagT<129U,_Fixpp::Type::String>,_Fixpp::TagT<145U,_Fixpp::Type::String>,_Fixpp::TagT<43U,_Fixpp::Type::Boolean>,_Fixpp::TagT<97U,_Fixpp::Type::Boolean>,_Fixpp::Required<Fixpp::TagT<52U,_Fixpp::Type::UTCTimestamp>_>,_Fixpp::TagT<122U,_Fixpp::Type::UTCTimestamp>,_Fixpp::TagT<212U,_Fixpp::Type::Int>,_Fixpp::TagT<213U,_Fixpp::Type::Data>,_Fixpp::TagT<347U,_Fixpp::Type::String>,_Fixpp::TagT<369U,_Fixpp::Type::Int>,_Fixpp::TagT<370U,_Fixpp::Type::UTCTimestamp>_>
                            ).bits.super__Base_bitset<6UL>._M_w + 0x1a);
    *pbVar1 = *pbVar1 | 0x10;
    return;
  }
  pcVar8 = "Expected value after tag \'%d\', got EOF";
  type = Incomplete;
LAB_00403bb7:
  ParsingContext::setError(context,type,pcVar8,0xd4);
  return;
}

Assistant:

void parse(Field& field, ParsingContext& context, TagSet& tagSet, bool /* strict */, bool /* skipUnknown */)
            {
                auto& cursor = context.cursor;
                // @Todo: In Strict mode, validate the type of the Tag
                StreamCursor::Token valueToken(context.cursor);
                TRY_MATCH_UNTIL(SOH, "Expected value tag '%d', got EOF", TagT::Id);

                auto view = valueToken.view();
                TRY_ADVANCE("Expected value after tag '%d', got EOF", TagT::Id);

                field.set(view);
                tagSet.set(field.tag());
            }